

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void set_force_skip_flag(AV1_COMP *cpi,MACROBLOCK *x,uint sse,int *force_skip)

{
  int iVar1;
  uint uVar2;
  uint qstep_sq;
  int qstep;
  int *force_skip_local;
  uint sse_local;
  MACROBLOCK *x_local;
  AV1_COMP *cpi_local;
  
  if (((((x->txfm_search_params).tx_mode_search_type == '\x02') &&
       ((cpi->sf).rt_sf.tx_size_level_based_on_qstep != 0)) &&
      (1 < (cpi->sf).rt_sf.tx_size_level_based_on_qstep)) &&
     (((iVar1 = (int)x->plane[0].dequant_QTX[1] >> ((char)(x->e_mbd).bd - 5U & 0x1f),
       uVar2 = iVar1 * iVar1, sse < uVar2 && (x->source_variance < uVar2)) &&
      ((x->color_sensitivity[0] == '\0' && (x->color_sensitivity[1] == '\0')))))) {
    *force_skip = 1;
  }
  return;
}

Assistant:

static inline void set_force_skip_flag(const AV1_COMP *const cpi,
                                       MACROBLOCK *const x, unsigned int sse,
                                       int *force_skip) {
  if (x->txfm_search_params.tx_mode_search_type == TX_MODE_SELECT &&
      cpi->sf.rt_sf.tx_size_level_based_on_qstep &&
      cpi->sf.rt_sf.tx_size_level_based_on_qstep >= 2) {
    const int qstep = x->plane[AOM_PLANE_Y].dequant_QTX[1] >> (x->e_mbd.bd - 5);
    const unsigned int qstep_sq = qstep * qstep;
    // If the sse is low for low source variance blocks, mark those as
    // transform skip.
    // Note: Though qstep_sq is based on ac qstep, the threshold is kept
    // low so that reliable early estimate of tx skip can be obtained
    // through its comparison with sse.
    if (sse < qstep_sq && x->source_variance < qstep_sq &&
        x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
        x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
      *force_skip = 1;
  }
}